

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_insert_sibling(lyd_node *sibling,lyd_node *node,lyd_node **first)

{
  LY_ERR LVar1;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_node *first_sibling;
  lyd_node **first_local;
  lyd_node *node_local;
  lyd_node *sibling_local;
  
  first_sibling = (lyd_node *)first;
  first_local = (lyd_node **)node;
  node_local = sibling;
  if (node == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node",
           "lyd_insert_sibling");
    sibling_local._4_4_ = LY_EINVAL;
  }
  else if (sibling == node) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","sibling != node",
           "lyd_insert_sibling");
    sibling_local._4_4_ = LY_EINVAL;
  }
  else if ((sibling == (lyd_node *)0x0) ||
          (sibling_local._4_4_ =
                lyd_insert_check_schema((lysc_node *)0x0,sibling->schema,node->schema),
          sibling_local._4_4_ == LY_SUCCESS)) {
    _ret___1 = lyd_first_sibling(node_local);
    if ((first_local[2] == (lyd_node *)0x0) &&
       ((first_local[4]->next == (lyd_node *)0x0 && (first_local[3] != (lyd_node *)0x0)))) {
      LVar1 = lyd_move_nodes((lyd_node *)0x0,(lyd_node **)&ret___1,(lyd_node *)first_local);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
    else {
      LVar1 = lyd_unlink_tree((lyd_node *)first_local);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      lyd_insert_node((lyd_node *)0x0,(lyd_node **)&ret___1,(lyd_node *)first_local,0);
    }
    if (first_sibling != (lyd_node *)0x0) {
      *(lyd_node **)first_sibling = _ret___1;
    }
    sibling_local._4_4_ = LY_SUCCESS;
  }
  return sibling_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_insert_sibling(struct lyd_node *sibling, struct lyd_node *node, struct lyd_node **first)
{
    struct lyd_node *first_sibling;

    LY_CHECK_ARG_RET(NULL, node, sibling != node, LY_EINVAL);

    if (sibling) {
        LY_CHECK_RET(lyd_insert_check_schema(NULL, sibling->schema, node->schema));
    }

    first_sibling = lyd_first_sibling(sibling);
    if (node->parent || node->prev->next || !node->next) {
        LY_CHECK_RET(lyd_unlink_tree(node));
        lyd_insert_node(NULL, &first_sibling, node, LYD_INSERT_NODE_DEFAULT);
    } else {
        LY_CHECK_RET(lyd_move_nodes(NULL, &first_sibling, node));
    }

    if (first) {
        *first = first_sibling;
    }

    return LY_SUCCESS;
}